

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderReturnTests.cpp
# Opt level: O0

int __thiscall
vkt::sr::anon_unknown_0::ShaderReturnTests::init(ShaderReturnTests *this,EVP_PKEY_CTX *ctx)

{
  TestContext *pTVar1;
  int iVar2;
  TestNode *pTVar3;
  char *pcVar4;
  ReturnTestUniformSetup *pRVar5;
  allocator<char> local_6b9;
  string local_6b8;
  allocator<char> local_691;
  string local_690;
  allocator<char> local_669;
  string local_668;
  undefined1 local_642;
  allocator<char> local_641;
  string local_640;
  allocator<char> local_619;
  string local_618;
  allocator<char> local_5f1;
  string local_5f0;
  undefined1 local_5d0 [8];
  MovePtr<vkt::sr::(anonymous_namespace)::ShaderReturnCase,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::ShaderReturnCase>_>
  testCase_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5b8;
  undefined1 local_598 [8];
  string description_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_570;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_550;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_530;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_510;
  undefined1 local_4f0 [8];
  string name_2;
  ReturnMode local_4c8;
  int isFragment_2;
  int returnMode_2;
  int isDynamicLoop;
  MovePtr<vkt::sr::(anonymous_namespace)::ShaderReturnCase,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::ShaderReturnCase>_>
  testCase_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_488;
  undefined1 local_468 [8];
  string desc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_440;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_420;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_400;
  undefined1 local_3e0 [8];
  string name_1;
  int isFragment_1;
  int returnMode_1;
  int inFunc;
  allocator<char> local_389;
  string local_388;
  allocator<char> local_361;
  string local_360;
  undefined1 local_33a;
  allocator<char> local_339;
  string local_338;
  allocator<char> local_311;
  string local_310;
  allocator<char> local_2e9;
  string local_2e8;
  undefined1 local_2c2;
  allocator<char> local_2c1;
  string local_2c0;
  allocator<char> local_299;
  string local_298;
  allocator<char> local_271;
  string local_270;
  undefined1 local_24a;
  allocator<char> local_249;
  string local_248;
  allocator<char> local_221;
  string local_220;
  allocator<char> local_1f9;
  string local_1f8;
  undefined1 local_1d8 [8];
  MovePtr<vkt::sr::(anonymous_namespace)::ShaderReturnCase,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::ShaderReturnCase>_>
  testCase;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  undefined1 local_1a0 [8];
  string description;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  undefined1 local_138 [8];
  string name;
  ReturnMode local_110;
  int isFragment;
  int returnMode;
  allocator<char> local_e1;
  string local_e0;
  allocator<char> local_b9;
  string local_b8;
  undefined1 local_92;
  allocator<char> local_91;
  string local_90;
  allocator<char> local_69;
  string local_68;
  allocator<char> local_31;
  string local_30;
  ShaderReturnTests *local_10;
  ShaderReturnTests *this_local;
  
  local_10 = this;
  pTVar3 = (TestNode *)operator_new(0xe0);
  local_92 = 1;
  pTVar1 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"single_return_vertex",&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"Single return statement in function",&local_69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,
             "#version 310 es\nlayout(location = 0) in highp vec4 a_position;\nlayout(location = 1) in highp vec4 a_coords;\nlayout(location = 0) out mediump vec4 v_color;\n\nvec4 getColor (void)\n{\n    return vec4(a_coords.xyz, 1.0);\n}\n\nvoid main (void)\n{\n    gl_Position = a_position;\n    v_color = getColor();\n}\n"
             ,&local_91);
  ShaderReturnCase::ShaderReturnCase
            ((ShaderReturnCase *)pTVar3,pTVar1,&local_30,&local_68,true,&local_90,evalReturnAlways,
             (UniformSetup *)0x0);
  local_92 = 0;
  tcu::TestNode::addChild((TestNode *)this,pTVar3);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator(&local_91);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  pTVar3 = (TestNode *)operator_new(0xe0);
  isFragment._2_1_ = 1;
  pTVar1 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,"single_return_fragment",&local_b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e0,"Single return statement in function",&local_e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&returnMode,
             "#version 310 es\nlayout(location = 0) in mediump vec4 v_coords;\nlayout(location = 0) out mediump vec4 o_color;\nmediump vec4 getColor (void)\n{\n    return vec4(v_coords.xyz, 1.0);\n}\n\nvoid main (void)\n{\n    o_color = getColor();\n}\n"
             ,(allocator<char> *)((long)&isFragment + 3));
  ShaderReturnCase::ShaderReturnCase
            ((ShaderReturnCase *)pTVar3,pTVar1,&local_b8,&local_e0,false,(string *)&returnMode,
             evalReturnAlways,(UniformSetup *)0x0);
  isFragment._2_1_ = 0;
  tcu::TestNode::addChild((TestNode *)this,pTVar3);
  std::__cxx11::string::~string((string *)&returnMode);
  std::allocator<char>::~allocator((allocator<char> *)((long)&isFragment + 3));
  std::__cxx11::string::~string((string *)&local_e0);
  std::allocator<char>::~allocator(&local_e1);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator(&local_b9);
  for (local_110 = RETURNMODE_ALWAYS; (int)local_110 < 3; local_110 = local_110 + RETURNMODE_NEVER)
  {
    for (name.field_2._12_4_ = 0; (int)name.field_2._12_4_ < 2;
        name.field_2._12_4_ = name.field_2._12_4_ + 1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_178,"conditional_return_",
                 (allocator<char> *)(description.field_2._M_local_buf + 0xf));
      pcVar4 = getReturnModeName(local_110);
      std::operator+(&local_158,&local_178,pcVar4);
      pcVar4 = "basic_vertex";
      if (name.field_2._12_4_ != 0) {
        pcVar4 = "basic_fragment";
      }
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138,
                     &local_158,pcVar4 + 5);
      std::__cxx11::string::~string((string *)&local_158);
      std::__cxx11::string::~string((string *)&local_178);
      std::allocator<char>::~allocator((allocator<char> *)(description.field_2._M_local_buf + 0xf));
      pcVar4 = getReturnModeDesc(local_110);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1c0,pcVar4,
                 (allocator<char> *)
                 &testCase.
                  super_UniqueBase<vkt::sr::(anonymous_namespace)::ShaderReturnCase,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::ShaderReturnCase>_>
                  .m_data.field_0xf);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a0,
                     &local_1c0," in function");
      std::__cxx11::string::~string((string *)&local_1c0);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 &testCase.
                  super_UniqueBase<vkt::sr::(anonymous_namespace)::ShaderReturnCase,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::ShaderReturnCase>_>
                  .m_data.field_0xf);
      makeConditionalReturnInFuncCase
                ((MovePtr<vkt::sr::(anonymous_namespace)::ShaderReturnCase,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::ShaderReturnCase>_>
                  *)local_1d8,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
                 (string *)local_138,(string *)local_1a0,local_110,name.field_2._12_4_ == 0);
      pTVar3 = (TestNode *)
               de::details::
               MovePtr<vkt::sr::(anonymous_namespace)::ShaderReturnCase,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::ShaderReturnCase>_>
               ::release((MovePtr<vkt::sr::(anonymous_namespace)::ShaderReturnCase,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::ShaderReturnCase>_>
                          *)local_1d8);
      tcu::TestNode::addChild((TestNode *)this,pTVar3);
      de::details::
      MovePtr<vkt::sr::(anonymous_namespace)::ShaderReturnCase,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::ShaderReturnCase>_>
      ::~MovePtr((MovePtr<vkt::sr::(anonymous_namespace)::ShaderReturnCase,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::ShaderReturnCase>_>
                  *)local_1d8);
      std::__cxx11::string::~string((string *)local_1a0);
      std::__cxx11::string::~string((string *)local_138);
    }
  }
  pTVar3 = (TestNode *)operator_new(0xe0);
  local_24a = 1;
  pTVar1 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f8,"double_return_vertex",&local_1f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_220,"Unconditional double return in function",&local_221);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_248,
             "#version 310 es\nlayout(location = 0) in highp vec4 a_position;\nlayout(location = 1) in highp vec4 a_coords;\nlayout(location = 0) out mediump vec4 v_color;\n\nvec4 getColor (void)\n{\n    return vec4(a_coords.xyz, 1.0);\n    return vec4(a_coords.wzy, 1.0);\n}\n\nvoid main (void)\n{\n    gl_Position = a_position;\n    v_color = getColor();\n}\n"
             ,&local_249);
  ShaderReturnCase::ShaderReturnCase
            ((ShaderReturnCase *)pTVar3,pTVar1,&local_1f8,&local_220,true,&local_248,
             evalReturnAlways,(UniformSetup *)0x0);
  local_24a = 0;
  tcu::TestNode::addChild((TestNode *)this,pTVar3);
  std::__cxx11::string::~string((string *)&local_248);
  std::allocator<char>::~allocator(&local_249);
  std::__cxx11::string::~string((string *)&local_220);
  std::allocator<char>::~allocator(&local_221);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::allocator<char>::~allocator(&local_1f9);
  pTVar3 = (TestNode *)operator_new(0xe0);
  local_2c2 = 1;
  pTVar1 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_270,"double_return_fragment",&local_271);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_298,"Unconditional double return in function",&local_299);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2c0,
             "#version 310 es\nlayout(location = 0) in mediump vec4 v_coords;\nlayout(location = 0) out mediump vec4 o_color;\n\nmediump vec4 getColor (void)\n{\n    return vec4(v_coords.xyz, 1.0);\n    return vec4(v_coords.wzy, 1.0);\n}\n\nvoid main (void)\n{\n    o_color = getColor();\n}\n"
             ,&local_2c1);
  ShaderReturnCase::ShaderReturnCase
            ((ShaderReturnCase *)pTVar3,pTVar1,&local_270,&local_298,false,&local_2c0,
             evalReturnAlways,(UniformSetup *)0x0);
  local_2c2 = 0;
  tcu::TestNode::addChild((TestNode *)this,pTVar3);
  std::__cxx11::string::~string((string *)&local_2c0);
  std::allocator<char>::~allocator(&local_2c1);
  std::__cxx11::string::~string((string *)&local_298);
  std::allocator<char>::~allocator(&local_299);
  std::__cxx11::string::~string((string *)&local_270);
  std::allocator<char>::~allocator(&local_271);
  pTVar3 = (TestNode *)operator_new(0xe0);
  local_33a = 1;
  pTVar1 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2e8,"last_statement_in_main_vertex",&local_2e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_310,"Return as a final statement in main()",&local_311);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_338,
             "#version 310 es\nlayout(location = 0) in highp vec4 a_position;\nlayout(location = 1) in highp vec4 a_coords;\nlayout(location = 0) out mediump vec4 v_color;\n\nvoid main (void)\n{\n    gl_Position = a_position;\n    v_color = vec4(a_coords.xyz, 1.0);\n    return;\n}\n"
             ,&local_339);
  ShaderReturnCase::ShaderReturnCase
            ((ShaderReturnCase *)pTVar3,pTVar1,&local_2e8,&local_310,true,&local_338,
             evalReturnAlways,(UniformSetup *)0x0);
  local_33a = 0;
  tcu::TestNode::addChild((TestNode *)this,pTVar3);
  std::__cxx11::string::~string((string *)&local_338);
  std::allocator<char>::~allocator(&local_339);
  std::__cxx11::string::~string((string *)&local_310);
  std::allocator<char>::~allocator(&local_311);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::allocator<char>::~allocator(&local_2e9);
  pTVar3 = (TestNode *)operator_new(0xe0);
  returnMode_1._2_1_ = 1;
  pTVar1 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_360,"last_statement_in_main_fragment",&local_361);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_388,"Return as a final statement in main()",&local_389);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&inFunc,
             "#version 310 es\nlayout(location = 0) in mediump vec4 v_coords;\nlayout(location = 0) out mediump vec4 o_color;\n\nvoid main (void)\n{\n    o_color = vec4(v_coords.xyz, 1.0);\n    return;\n}\n"
             ,(allocator<char> *)((long)&returnMode_1 + 3));
  ShaderReturnCase::ShaderReturnCase
            ((ShaderReturnCase *)pTVar3,pTVar1,&local_360,&local_388,false,(string *)&inFunc,
             evalReturnAlways,(UniformSetup *)0x0);
  returnMode_1._2_1_ = 0;
  tcu::TestNode::addChild((TestNode *)this,pTVar3);
  std::__cxx11::string::~string((string *)&inFunc);
  std::allocator<char>::~allocator((allocator<char> *)((long)&returnMode_1 + 3));
  std::__cxx11::string::~string((string *)&local_388);
  std::allocator<char>::~allocator(&local_389);
  std::__cxx11::string::~string((string *)&local_360);
  std::allocator<char>::~allocator(&local_361);
  for (isFragment_1 = 0; isFragment_1 < 2; isFragment_1 = isFragment_1 + 1) {
    for (name_1.field_2._12_4_ = 0; (int)name_1.field_2._12_4_ < 3;
        name_1.field_2._12_4_ = name_1.field_2._12_4_ + 1) {
      for (name_1.field_2._8_4_ = 0; (int)name_1.field_2._8_4_ < 2;
          name_1.field_2._8_4_ = name_1.field_2._8_4_ + 1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_440,"output_write_",
                   (allocator<char> *)(desc.field_2._M_local_buf + 0xf));
        pcVar4 = "";
        if (isFragment_1 != 0) {
          pcVar4 = "in_func_";
        }
        std::operator+(&local_420,&local_440,pcVar4);
        pcVar4 = getReturnModeName(name_1.field_2._12_4_);
        std::operator+(&local_400,&local_420,pcVar4);
        pcVar4 = "basic_vertex";
        if (name_1.field_2._8_4_ != 0) {
          pcVar4 = "basic_fragment";
        }
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_3e0,&local_400,pcVar4 + 5);
        std::__cxx11::string::~string((string *)&local_400);
        std::__cxx11::string::~string((string *)&local_420);
        std::__cxx11::string::~string((string *)&local_440);
        std::allocator<char>::~allocator((allocator<char> *)(desc.field_2._M_local_buf + 0xf));
        pcVar4 = getReturnModeDesc(name_1.field_2._12_4_);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_4a8,pcVar4,
                   (allocator<char> *)
                   &testCase_1.
                    super_UniqueBase<vkt::sr::(anonymous_namespace)::ShaderReturnCase,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::ShaderReturnCase>_>
                    .m_data.field_0xf);
        pcVar4 = " in main()";
        if (isFragment_1 != 0) {
          pcVar4 = " in user-defined function";
        }
        std::operator+(&local_488,&local_4a8,pcVar4);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_468,&local_488," between output writes");
        std::__cxx11::string::~string((string *)&local_488);
        std::__cxx11::string::~string((string *)&local_4a8);
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   &testCase_1.
                    super_UniqueBase<vkt::sr::(anonymous_namespace)::ShaderReturnCase,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::ShaderReturnCase>_>
                    .m_data.field_0xf);
        makeOutputWriteReturnCase
                  ((MovePtr<vkt::sr::(anonymous_namespace)::ShaderReturnCase,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::ShaderReturnCase>_>
                    *)&returnMode_2,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
                   (string *)local_3e0,(string *)local_468,isFragment_1 != 0,name_1.field_2._12_4_,
                   name_1.field_2._8_4_ == 0);
        pTVar3 = (TestNode *)
                 de::details::
                 MovePtr<vkt::sr::(anonymous_namespace)::ShaderReturnCase,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::ShaderReturnCase>_>
                 ::release((MovePtr<vkt::sr::(anonymous_namespace)::ShaderReturnCase,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::ShaderReturnCase>_>
                            *)&returnMode_2);
        tcu::TestNode::addChild((TestNode *)this,pTVar3);
        de::details::
        MovePtr<vkt::sr::(anonymous_namespace)::ShaderReturnCase,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::ShaderReturnCase>_>
        ::~MovePtr((MovePtr<vkt::sr::(anonymous_namespace)::ShaderReturnCase,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::ShaderReturnCase>_>
                    *)&returnMode_2);
        std::__cxx11::string::~string((string *)local_468);
        std::__cxx11::string::~string((string *)local_3e0);
      }
    }
  }
  for (isFragment_2 = 0; isFragment_2 < 2; isFragment_2 = isFragment_2 + 1) {
    for (local_4c8 = RETURNMODE_ALWAYS; (int)local_4c8 < 3; local_4c8 = local_4c8 + RETURNMODE_NEVER
        ) {
      for (name_2.field_2._12_4_ = 0; (int)name_2.field_2._12_4_ < 2;
          name_2.field_2._12_4_ = name_2.field_2._12_4_ + 1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_570,"return_in_",
                   (allocator<char> *)(description_1.field_2._M_local_buf + 0xf));
        pcVar4 = "static";
        if (isFragment_2 != 0) {
          pcVar4 = "dynamic";
        }
        std::operator+(&local_550,&local_570,pcVar4);
        std::operator+(&local_530,&local_550,"_loop_");
        pcVar4 = getReturnModeName(local_4c8);
        std::operator+(&local_510,&local_530,pcVar4);
        pcVar4 = "basic_vertex";
        if (name_2.field_2._12_4_ != 0) {
          pcVar4 = "basic_fragment";
        }
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_4f0,&local_510,pcVar4 + 5);
        std::__cxx11::string::~string((string *)&local_510);
        std::__cxx11::string::~string((string *)&local_530);
        std::__cxx11::string::~string((string *)&local_550);
        std::__cxx11::string::~string((string *)&local_570);
        std::allocator<char>::~allocator
                  ((allocator<char> *)(description_1.field_2._M_local_buf + 0xf));
        pcVar4 = getReturnModeDesc(local_4c8);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_5b8,pcVar4,
                   (allocator<char> *)
                   &testCase_2.
                    super_UniqueBase<vkt::sr::(anonymous_namespace)::ShaderReturnCase,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::ShaderReturnCase>_>
                    .m_data.field_0xf);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_598,&local_5b8," in loop");
        std::__cxx11::string::~string((string *)&local_5b8);
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   &testCase_2.
                    super_UniqueBase<vkt::sr::(anonymous_namespace)::ShaderReturnCase,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::ShaderReturnCase>_>
                    .m_data.field_0xf);
        makeReturnInLoopCase
                  ((MovePtr<vkt::sr::(anonymous_namespace)::ShaderReturnCase,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::ShaderReturnCase>_>
                    *)local_5d0,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
                   (string *)local_4f0,(string *)local_598,isFragment_2 != 0,local_4c8,
                   name_2.field_2._12_4_ == 0);
        pTVar3 = (TestNode *)
                 de::details::
                 MovePtr<vkt::sr::(anonymous_namespace)::ShaderReturnCase,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::ShaderReturnCase>_>
                 ::release((MovePtr<vkt::sr::(anonymous_namespace)::ShaderReturnCase,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::ShaderReturnCase>_>
                            *)local_5d0);
        tcu::TestNode::addChild((TestNode *)this,pTVar3);
        de::details::
        MovePtr<vkt::sr::(anonymous_namespace)::ShaderReturnCase,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::ShaderReturnCase>_>
        ::~MovePtr((MovePtr<vkt::sr::(anonymous_namespace)::ShaderReturnCase,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::ShaderReturnCase>_>
                    *)local_5d0);
        std::__cxx11::string::~string((string *)local_598);
        std::__cxx11::string::~string((string *)local_4f0);
      }
    }
  }
  pTVar3 = (TestNode *)operator_new(0xe0);
  local_642 = 1;
  pTVar1 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5f0,"return_in_infinite_loop_vertex",&local_5f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_618,"Return in infinite loop",&local_619);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_640,
             "#version 310 es\nlayout(location = 0) in highp vec4 a_position;\nlayout(location = 1) in highp vec4 a_coords;\nlayout(location = 0) out mediump vec4 v_color;\nlayout(binding = 0, std140) uniform something { int ui_zero; };\nhighp vec4 getCoords (void)\n{\n\tfor (int i = 1; i < 10; i += ui_zero)\n\t\treturn a_coords;\n\treturn a_coords.wzyx;\n}\n\nvoid main (void)\n{\n    gl_Position = a_position;\n    v_color = vec4(getCoords().xyz, 1.0);\n    return;\n}\n"
             ,&local_641);
  pRVar5 = (ReturnTestUniformSetup *)operator_new(0x18);
  ReturnTestUniformSetup::ReturnTestUniformSetup(pRVar5,UI_ZERO);
  ShaderReturnCase::ShaderReturnCase
            ((ShaderReturnCase *)pTVar3,pTVar1,&local_5f0,&local_618,true,&local_640,
             evalReturnAlways,(UniformSetup *)pRVar5);
  local_642 = 0;
  tcu::TestNode::addChild((TestNode *)this,pTVar3);
  std::__cxx11::string::~string((string *)&local_640);
  std::allocator<char>::~allocator(&local_641);
  std::__cxx11::string::~string((string *)&local_618);
  std::allocator<char>::~allocator(&local_619);
  std::__cxx11::string::~string((string *)&local_5f0);
  std::allocator<char>::~allocator(&local_5f1);
  pTVar3 = (TestNode *)operator_new(0xe0);
  pTVar1 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_668,"return_in_infinite_loop_fragment",&local_669);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_690,"Return in infinite loop",&local_691);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6b8,
             "#version 310 es\nlayout(location = 0) in mediump vec4 v_coords;\nlayout(location = 0) out mediump vec4 o_color;\nlayout(binding = 0, std140) uniform something { int ui_zero; };\n\nmediump vec4 getCoords (void)\n{\n\tfor (int i = 1; i < 10; i += ui_zero)\n\t\treturn v_coords;\n\treturn v_coords.wzyx;\n}\n\nvoid main (void)\n{\n    o_color = vec4(getCoords().xyz, 1.0);\n    return;\n}\n"
             ,&local_6b9);
  pRVar5 = (ReturnTestUniformSetup *)operator_new(0x18);
  ReturnTestUniformSetup::ReturnTestUniformSetup(pRVar5,UI_ZERO);
  ShaderReturnCase::ShaderReturnCase
            ((ShaderReturnCase *)pTVar3,pTVar1,&local_668,&local_690,false,&local_6b8,
             evalReturnAlways,(UniformSetup *)pRVar5);
  tcu::TestNode::addChild((TestNode *)this,pTVar3);
  std::__cxx11::string::~string((string *)&local_6b8);
  std::allocator<char>::~allocator(&local_6b9);
  std::__cxx11::string::~string((string *)&local_690);
  std::allocator<char>::~allocator(&local_691);
  std::__cxx11::string::~string((string *)&local_668);
  iVar2 = std::allocator<char>::~allocator(&local_669);
  return iVar2;
}

Assistant:

void ShaderReturnTests::init (void)
{
	addChild(new ShaderReturnCase(m_testCtx, "single_return_vertex", "Single return statement in function", true,
		"#version 310 es\n"
		"layout(location = 0) in highp vec4 a_position;\n"
		"layout(location = 1) in highp vec4 a_coords;\n"
		"layout(location = 0) out mediump vec4 v_color;\n\n"
		"vec4 getColor (void)\n"
		"{\n"
		"    return vec4(a_coords.xyz, 1.0);\n"
		"}\n\n"
		"void main (void)\n"
		"{\n"
		"    gl_Position = a_position;\n"
		"    v_color = getColor();\n"
		"}\n", evalReturnAlways, DE_NULL));
	addChild(new ShaderReturnCase(m_testCtx, "single_return_fragment", "Single return statement in function", false,
		"#version 310 es\n"
		"layout(location = 0) in mediump vec4 v_coords;\n"
		"layout(location = 0) out mediump vec4 o_color;\n"
		"mediump vec4 getColor (void)\n"
		"{\n"
		"    return vec4(v_coords.xyz, 1.0);\n"
		"}\n\n"
		"void main (void)\n"
		"{\n"
		"    o_color = getColor();\n"
		"}\n", evalReturnAlways, DE_NULL));

	// Conditional return statement in function.
	for (int returnMode = 0; returnMode < RETURNMODE_LAST; returnMode++)
	{
		for (int isFragment = 0; isFragment < 2; isFragment++)
		{
			std::string						name		= std::string("conditional_return_") + getReturnModeName((ReturnMode)returnMode) + (isFragment ? "_fragment" : "_vertex");
			std::string						description	= std::string(getReturnModeDesc((ReturnMode)returnMode)) + " in function";
			de::MovePtr<ShaderReturnCase>	testCase	(makeConditionalReturnInFuncCase(m_testCtx, name, description, (ReturnMode)returnMode, isFragment == 0));
			addChild(testCase.release());
		}
	}

	// Unconditional double return in function.
	addChild(new ShaderReturnCase(m_testCtx, "double_return_vertex", "Unconditional double return in function", true,
		"#version 310 es\n"
		"layout(location = 0) in highp vec4 a_position;\n"
		"layout(location = 1) in highp vec4 a_coords;\n"
		"layout(location = 0) out mediump vec4 v_color;\n\n"
		"vec4 getColor (void)\n"
		"{\n"
		"    return vec4(a_coords.xyz, 1.0);\n"
		"    return vec4(a_coords.wzy, 1.0);\n"
		"}\n\n"
		"void main (void)\n"
		"{\n"
		"    gl_Position = a_position;\n"
		"    v_color = getColor();\n"
		"}\n", evalReturnAlways, DE_NULL));
	addChild(new ShaderReturnCase(m_testCtx, "double_return_fragment", "Unconditional double return in function", false,
		"#version 310 es\n"
		"layout(location = 0) in mediump vec4 v_coords;\n"
		"layout(location = 0) out mediump vec4 o_color;\n\n"
		"mediump vec4 getColor (void)\n"
		"{\n"
		"    return vec4(v_coords.xyz, 1.0);\n"
		"    return vec4(v_coords.wzy, 1.0);\n"
		"}\n\n"
		"void main (void)\n"
		"{\n"
		"    o_color = getColor();\n"
		"}\n", evalReturnAlways, DE_NULL));

	// Last statement in main.
	addChild(new ShaderReturnCase(m_testCtx, "last_statement_in_main_vertex", "Return as a final statement in main()", true,
		"#version 310 es\n"
		"layout(location = 0) in highp vec4 a_position;\n"
		"layout(location = 1) in highp vec4 a_coords;\n"
		"layout(location = 0) out mediump vec4 v_color;\n\n"
		"void main (void)\n"
		"{\n"
		"    gl_Position = a_position;\n"
		"    v_color = vec4(a_coords.xyz, 1.0);\n"
		"    return;\n"
		"}\n", evalReturnAlways, DE_NULL));
	addChild(new ShaderReturnCase(m_testCtx, "last_statement_in_main_fragment", "Return as a final statement in main()", false,
		"#version 310 es\n"
		"layout(location = 0) in mediump vec4 v_coords;\n"
		"layout(location = 0) out mediump vec4 o_color;\n\n"
		"void main (void)\n"
		"{\n"
		"    o_color = vec4(v_coords.xyz, 1.0);\n"
		"    return;\n"
		"}\n", evalReturnAlways, DE_NULL));

	// Return between output variable writes.
	for (int inFunc = 0; inFunc < 2; inFunc++)
	{
		for (int returnMode = 0; returnMode < RETURNMODE_LAST; returnMode++)
		{
			for (int isFragment = 0; isFragment < 2; isFragment++)
			{
				std::string						name		= std::string("output_write_") + (inFunc ? "in_func_" : "") + getReturnModeName((ReturnMode)returnMode) + (isFragment ? "_fragment" : "_vertex");
				std::string						desc		= std::string(getReturnModeDesc((ReturnMode)returnMode)) + (inFunc ? " in user-defined function" : " in main()") + " between output writes";
				de::MovePtr<ShaderReturnCase>	testCase	= (makeOutputWriteReturnCase(m_testCtx, name, desc, inFunc != 0, (ReturnMode)returnMode, isFragment == 0));
				addChild(testCase.release());
			}
		}
	}

	// Conditional return statement in loop.
	for (int isDynamicLoop = 0; isDynamicLoop < 2; isDynamicLoop++)
	{
		for (int returnMode = 0; returnMode < RETURNMODE_LAST; returnMode++)
		{
			for (int isFragment = 0; isFragment < 2; isFragment++)
			{
				std::string						name		= std::string("return_in_") + (isDynamicLoop ? "dynamic" : "static") + "_loop_" + getReturnModeName((ReturnMode)returnMode) + (isFragment ? "_fragment" : "_vertex");
				std::string						description	= std::string(getReturnModeDesc((ReturnMode)returnMode)) + " in loop";
				de::MovePtr<ShaderReturnCase>	testCase	(makeReturnInLoopCase(m_testCtx, name, description, isDynamicLoop != 0, (ReturnMode)returnMode, isFragment == 0));
				addChild(testCase.release());
			}
		}
	}

	// Unconditional return in infinite loop.
	addChild(new ShaderReturnCase(m_testCtx, "return_in_infinite_loop_vertex", "Return in infinite loop", true,
		"#version 310 es\n"
		"layout(location = 0) in highp vec4 a_position;\n"
		"layout(location = 1) in highp vec4 a_coords;\n"
		"layout(location = 0) out mediump vec4 v_color;\n"
		"layout(binding = 0, std140) uniform something { int ui_zero; };\n"
		"highp vec4 getCoords (void)\n"
		"{\n"
		"	for (int i = 1; i < 10; i += ui_zero)\n"
		"		return a_coords;\n"
		"	return a_coords.wzyx;\n"
		"}\n\n"
		"void main (void)\n"
		"{\n"
		"    gl_Position = a_position;\n"
		"    v_color = vec4(getCoords().xyz, 1.0);\n"
		"    return;\n"
		"}\n", evalReturnAlways, new ReturnTestUniformSetup(UI_ZERO)));
	addChild(new ShaderReturnCase(m_testCtx, "return_in_infinite_loop_fragment", "Return in infinite loop", false,
		"#version 310 es\n"
		"layout(location = 0) in mediump vec4 v_coords;\n"
		"layout(location = 0) out mediump vec4 o_color;\n"
		"layout(binding = 0, std140) uniform something { int ui_zero; };\n\n"
		"mediump vec4 getCoords (void)\n"
		"{\n"
		"	for (int i = 1; i < 10; i += ui_zero)\n"
		"		return v_coords;\n"
		"	return v_coords.wzyx;\n"
		"}\n\n"
		"void main (void)\n"
		"{\n"
		"    o_color = vec4(getCoords().xyz, 1.0);\n"
		"    return;\n"
		"}\n", evalReturnAlways, new ReturnTestUniformSetup(UI_ZERO)));
}